

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

void __thiscall
icu_63::MaybeStackArray<char16_t,_4>::MaybeStackArray
          (MaybeStackArray<char16_t,_4> *this,int32_t newCapacity)

{
  this->ptr = this->stackArray;
  this->capacity = 4;
  this->needToRelease = '\0';
  if (4 < newCapacity) {
    resize(this,newCapacity,0);
  }
  return;
}

Assistant:

MaybeStackArray() : ptr(stackArray), capacity(stackCapacity), needToRelease(FALSE) {}